

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

bool __thiscall
HEkk::proofOfPrimalInfeasibility(HEkk *this,HVector *row_ep,HighsInt move_out,HighsInt row_out)

{
  vector<double,_std::allocator<double>_> *result_value;
  vector<int,_std::allocator<int>_> *result_index;
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  double *pdVar3;
  bool bVar4;
  pointer piVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  pointer pdVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  int iVar11;
  char *pcVar12;
  HighsSparseMatrix *this_00;
  long lVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double local_110;
  double local_100;
  undefined1 local_f8 [24];
  double local_e0;
  double local_d8;
  double local_c8;
  double local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  vector<double,_std::allocator<double>_> local_88;
  string local_70;
  string local_50;
  
  bVar4 = this->debug_iteration_report_;
  bVar8 = (this->status_).has_ar_matrix;
  if (row_ep->count < 1) {
    local_e0 = 0.0;
    local_d8 = 0.0;
  }
  else {
    pdVar9 = (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = 0;
    iVar14 = 0;
    local_100 = 0.0;
    iVar11 = 0;
    local_110 = 0.0;
    auVar6._12_4_ = 0;
    auVar6._0_12_ = local_f8._4_12_;
    local_f8._0_16_ = auVar6 << 0x20;
    local_a8 = 0.0;
    local_d8 = 0.0;
    local_e0 = 0.0;
    do {
      uVar15 = (row_ep->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13];
      dVar21 = pdVar9[(int)uVar15];
      dVar20 = getMaxAbsRowValue(this,uVar15);
      if (ABS(dVar20 * dVar21) <= (this->options_->super_HighsOptionsStruct).small_matrix_value) {
        if (((bVar4 != false) && (iVar14 < 0x19)) && (local_100 < ABS(dVar21))) {
          printf("Zeroed row_ep.array[%6d] = %11.4g due to being small in contribution\n",
                 (ulong)uVar15);
          iVar14 = iVar14 + 1;
          local_100 = ABS(dVar21);
        }
LAB_00342aee:
        pdVar9 = (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9[(int)uVar15] = 0.0;
      }
      else {
        pdVar9 = (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar20 = pdVar9[(int)uVar15] * (double)move_out;
        pdVar9[(int)uVar15] = dVar20;
        if (dVar20 <= 0.0) {
          local_c8 = (this->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[(int)uVar15];
          bVar7 = highs_isInfinity(local_c8);
          if (bVar7) {
            if (((bVar4 != false) && ((int)local_f8._0_4_ < 0x19)) && (local_a8 < ABS(dVar21))) {
              printf("Zeroed row_ep.array[%6d] = %11.4g due to infinite upper bound\n",(ulong)uVar15
                    );
              local_f8._0_4_ = local_f8._0_4_ + 1;
              local_a8 = ABS(dVar21);
            }
            goto LAB_00342aee;
          }
        }
        else {
          local_c8 = (this->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[(int)uVar15];
          bVar7 = highs_isInfinity(-local_c8);
          if (bVar7) {
            if (((bVar4 != false) && (iVar11 < 0x19)) && (local_110 < ABS(dVar21))) {
              printf("Zeroed row_ep.array[%6d] = %11.4g due to infinite lower bound\n",(ulong)uVar15
                    );
              iVar11 = iVar11 + 1;
              local_110 = ABS(dVar21);
            }
            goto LAB_00342aee;
          }
        }
        pdVar9 = (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_c8 = local_c8 * pdVar9[(int)uVar15];
        dVar21 = local_e0 + local_c8;
        local_d8 = local_d8 +
                   (local_e0 - (dVar21 - local_c8)) + (local_c8 - (dVar21 - (dVar21 - local_c8)));
        local_e0 = dVar21;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < row_ep->count);
  }
  pdVar9 = (this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar9) {
    (this->proof_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar9;
  }
  result_value = &this->proof_value_;
  result_index = &this->proof_index_;
  piVar5 = (this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  this_00 = &(this->lp_).a_matrix_;
  if (bVar8 != false) {
    this_00 = &this->ar_matrix_;
  }
  HighsSparseMatrix::productTransposeQuad(this_00,result_value,result_index,row_ep,-2);
  uVar16 = (ulong)((long)(this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  uVar15 = (uint)uVar16;
  if (bVar4 != false) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Row e_p","");
    HSimplexNla::reportArray(&this->simplex_nla_,&local_50,(this->lp_).num_col_,row_ep,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Proof","");
    std::vector<double,_std::allocator<double>_>::vector(&local_88,result_value);
    std::vector<int,_std::allocator<int>_>::vector(&local_a0,result_index);
    HSimplexNla::reportVector(&this->simplex_nla_,&local_70,uVar15,&local_88,&local_a0,true);
    if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    printf("HEkk::proofOfPrimalInfeasibility row_ep.count = %d; proof_num_nz = %d; row_ep_scale = %g\n"
           ,0,(ulong)(uint)row_ep->count,uVar16 & 0xffffffff);
    dVar20 = 0.0;
    dVar21 = 0.0;
    local_f8._0_8_ = 0.0;
    if ((int)uVar15 < 1) goto LAB_00342fa2;
    uVar16 = 0;
    dVar21 = 0.0;
    iVar11 = 0;
    do {
      if (((this->basis_).nonbasicFlag_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start
           [(this->proof_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar16]] == '\0') &&
         (dVar20 = ABS((this->proof_value_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar16]),
         iVar11 < 0x19 && dVar21 < dVar20)) {
        printf("Proof entry %6d (Column %6d) is basic with value %11.4g\n",uVar16 & 0xffffffff);
        iVar11 = iVar11 + 1;
        dVar21 = dVar20;
      }
      uVar16 = uVar16 + 1;
    } while ((uVar15 & 0x7fffffff) != uVar16);
  }
  if ((int)uVar15 < 1) {
    dVar20 = 0.0;
    dVar21 = 0.0;
    local_f8._0_8_ = 0.0;
  }
  else {
    pvVar1 = &(this->lp_).col_lower_;
    pvVar2 = &(this->lp_).col_upper_;
    uVar16 = 0;
    local_110 = 0.0;
    local_f8._0_16_ = ZEXT816(0);
    dVar20 = 0.0;
    dVar21 = 0.0;
    do {
      iVar11 = (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar16];
      dVar19 = (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar16];
      if (dVar19 <= 0.0) {
        bVar8 = highs_isInfinity(-(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start[iVar11]);
        pvVar10 = pvVar1;
        if (bVar8) {
          dVar18 = local_110 - dVar19;
          uVar17 = local_f8._12_4_;
          dVar19 = (double)local_f8._0_8_ +
                   (local_110 - (dVar19 + dVar18)) + (-dVar19 - (dVar18 - (dVar19 + dVar18)));
          local_f8._8_4_ = local_f8._8_4_;
          local_f8._0_8_ = dVar19;
          local_f8._12_4_ = uVar17;
          dVar19 = dVar18 + dVar19;
          pdVar3 = &(this->options_->super_HighsOptionsStruct).small_matrix_value;
          bVar8 = dVar19 == *pdVar3;
          bVar7 = dVar19 < *pdVar3;
          local_110 = dVar18;
          goto LAB_00342f22;
        }
LAB_00342f32:
        dVar19 = dVar19 * (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[iVar11];
        dVar18 = dVar21 + dVar19;
        dVar20 = dVar20 + (dVar21 - (dVar18 - dVar19)) + (dVar19 - (dVar18 - (dVar18 - dVar19)));
      }
      else {
        bVar8 = highs_isInfinity((pvVar2->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_start[iVar11]);
        pvVar10 = pvVar2;
        if (!bVar8) goto LAB_00342f32;
        dVar18 = local_110 + dVar19;
        local_f8._0_8_ =
             (double)local_f8._0_8_ +
             ((dVar18 - dVar19) - dVar18) + dVar19 + (local_110 - (dVar18 - dVar19));
        dVar19 = dVar18 + (double)local_f8._0_8_;
        pdVar3 = &(this->options_->super_HighsOptionsStruct).small_matrix_value;
        bVar8 = dVar19 == *pdVar3;
        bVar7 = dVar19 < *pdVar3;
        local_110 = dVar18;
LAB_00342f22:
        dVar18 = dVar21;
        if (!bVar7 && !bVar8) break;
      }
      uVar16 = uVar16 + 1;
      dVar21 = dVar18;
    } while ((uVar15 & 0x7fffffff) != uVar16);
    local_f8._0_8_ = (double)local_f8._0_8_ + local_110;
  }
LAB_00342fa2:
  dVar19 = (this->options_->super_HighsOptionsStruct).small_matrix_value;
  dVar18 = local_e0 - dVar21;
  dVar18 = ((local_d8 +
            (-dVar21 - (dVar18 - local_e0)) + (local_e0 - (dVar18 - (dVar18 - local_e0)))) - dVar20)
           + dVar18;
  bVar8 = (this->options_->super_HighsOptionsStruct).primal_feasibility_tolerance < dVar18;
  if (bVar4 != false) {
    pcVar12 = "in";
    if ((double)local_f8._0_8_ <= dVar19) {
      pcVar12 = "";
    }
    printf("HEkk::proofOfPrimalInfeasibility has %sfinite implied upper bound",pcVar12);
    if ((double)local_f8._0_8_ <= dVar19) {
      local_d8._0_4_ = SUB84(dVar18,0);
      printf(" and gap = %g",local_d8._0_4_);
    }
    pcVar12 = "false";
    if ((double)local_f8._0_8_ <= dVar19 && bVar8) {
      pcVar12 = "true";
    }
    printf(" so proof is %s\n",pcVar12);
  }
  return (double)local_f8._0_8_ <= dVar19 && bVar8;
}

Assistant:

bool HEkk::proofOfPrimalInfeasibility(HVector& row_ep, const HighsInt move_out,
                                      const HighsInt row_out) {
  // To be called from inside HEkkDual
  HighsLp& lp = this->lp_;

  HighsInt debug_product_report = kDebugReportOff;
  const bool debug_proof_report_on = true;
  bool debug_rows_report = false;
  bool debug_proof_report = false;
  if (debug_iteration_report_) {
    if (debug_proof_report_on)
      debug_product_report = kDebugReportOff;  // kDebugReportAll; //
    debug_rows_report = debug_proof_report_on;
    debug_proof_report = debug_proof_report_on;
  }

  const bool use_row_wise_matrix = status_.has_ar_matrix;
  const bool use_iterative_refinement = false;  // debug_iteration_report_;//
  if (use_iterative_refinement) {
    simplex_nla_.reportArray("Row e_p.0", lp.num_col_, &row_ep, true);
    unitBtranIterativeRefinement(row_out, row_ep);
    simplex_nla_.reportArray("Row e_p.1", lp.num_col_, &row_ep, true);
  }

  // Refine row_ep by removing relatively small values
  double row_ep_scale = 0;
  // if (use_refinement) refineArray(row_ep, row_ep_scale,
  // refinement_tolerance);
  // Determine the maximum absolute value in row_ep
  HighsCDouble proof_lower = 0.0;
  const HighsInt max_num_basic_proof_report = 25;
  const HighsInt max_num_zeroed_report = 25;
  HighsInt num_zeroed_for_small_report = 0;
  double max_zeroed_for_small_value = 0;
  HighsInt num_zeroed_for_lb_report = 0;
  double max_zeroed_for_lb_value = 0;
  HighsInt num_zeroed_for_ub_report = 0;
  double max_zeroed_for_ub_value = 0;
  for (HighsInt iX = 0; iX < row_ep.count; iX++) {
    HighsInt iRow = row_ep.index[iX];
    // Give row_ep the sign of the leaving row - as is done in
    // getDualRayInterface.
    const double row_ep_value = row_ep.array[iRow];
    assert(row_ep_value);
    if (std::abs(row_ep_value * getMaxAbsRowValue(iRow)) <=
        options_->small_matrix_value) {
      if (debug_proof_report) {
        const double abs_row_ep_value = std::abs(row_ep_value);
        if (num_zeroed_for_small_report < max_num_zeroed_report &&
            max_zeroed_for_small_value < abs_row_ep_value) {
          printf(
              "Zeroed row_ep.array[%6d] = %11.4g due to being small in "
              "contribution\n",
              (int)iRow, row_ep_value);
          num_zeroed_for_small_report++;
          max_zeroed_for_small_value = abs_row_ep_value;
        }
      }
      row_ep.array[iRow] = 0.0;
      continue;
    }

    row_ep.array[iRow] *= move_out;

    // make sure infinite sides are not used
    double rowBound;
    if (row_ep.array[iRow] > 0) {
      rowBound = lp.row_lower_[iRow];
      if (highs_isInfinity(-rowBound)) {
        // row lower bound is infinite
        if (debug_proof_report) {
          const double abs_row_ep_value = std::abs(row_ep_value);
          if (num_zeroed_for_lb_report < max_num_zeroed_report &&
              max_zeroed_for_lb_value < abs_row_ep_value) {
            printf(
                "Zeroed row_ep.array[%6d] = %11.4g due to infinite lower "
                "bound\n",
                (int)iRow, row_ep_value);
            num_zeroed_for_lb_report++;
            max_zeroed_for_lb_value = abs_row_ep_value;
          }
        }
        row_ep.array[iRow] = 0.0;
        continue;
      }

    } else {
      rowBound = lp.row_upper_[iRow];
      if (highs_isInfinity(rowBound)) {
        // row upper bound is infinite
        if (debug_proof_report) {
          const double abs_row_ep_value = std::abs(row_ep_value);
          if (num_zeroed_for_ub_report < max_num_zeroed_report &&
              max_zeroed_for_ub_value < abs_row_ep_value) {
            printf(
                "Zeroed row_ep.array[%6d] = %11.4g due to infinite upper "
                "bound\n",
                (int)iRow, row_ep_value);
            num_zeroed_for_ub_report++;
            max_zeroed_for_ub_value = abs_row_ep_value;
          }
        }
        row_ep.array[iRow] = 0.0;
        continue;
      }
    }
    // add up lower bound of proof constraint
    proof_lower += row_ep.array[iRow] * rowBound;
  }
  // Form the proof constraint coefficients
  proof_value_.clear();
  proof_index_.clear();
  vector<double>& proof_value = this->proof_value_;
  vector<HighsInt>& proof_index = this->proof_index_;
  if (use_row_wise_matrix) {
    this->ar_matrix_.productTransposeQuad(proof_value, proof_index, row_ep,
                                          debug_product_report);
  } else {
    lp.a_matrix_.productTransposeQuad(proof_value, proof_index, row_ep,
                                      debug_product_report);
  }

  HighsInt proof_num_nz = proof_index.size();
  if (debug_rows_report) {
    simplex_nla_.reportArray("Row e_p", lp.num_col_, &row_ep, true);
    simplex_nla_.reportVector("Proof", proof_num_nz, proof_value, proof_index,
                              true);
  }
  if (debug_proof_report) {
    printf(
        "HEkk::proofOfPrimalInfeasibility row_ep.count = %d; proof_num_nz = "
        "%d; row_ep_scale = %g\n",
        (int)row_ep.count, (int)proof_num_nz, row_ep_scale);
    HighsInt num_basic_proof_report = 0;
    double max_basic_proof_value = 0;
    for (HighsInt i = 0; i < proof_num_nz; ++i) {
      const HighsInt iCol = proof_index[i];
      const double value = proof_value[i];
      const double abs_value = std::abs(value);
      if (!basis_.nonbasicFlag_[iCol] && max_basic_proof_value < abs_value &&
          num_basic_proof_report < max_num_basic_proof_report) {
        printf("Proof entry %6d (Column %6d) is basic with value %11.4g\n",
               (int)i, (int)iCol, value);
        max_basic_proof_value = abs_value;
        num_basic_proof_report++;
      }
    }
  }
  HighsCDouble implied_upper = 0.0;
  HighsCDouble sumInf = 0.0;
  for (HighsInt i = 0; i < proof_num_nz; ++i) {
    const HighsInt iCol = proof_index[i];
    const double value = proof_value[i];
    if (value > 0) {
      if (highs_isInfinity(lp.col_upper_[iCol])) {
        sumInf += value;
        if (sumInf > options_->small_matrix_value) break;
        continue;
        // Commented out unreachable code
        //        if (value <= options_->small_matrix_value) continue;
      }
      implied_upper += value * lp.col_upper_[iCol];
    } else {
      if (highs_isInfinity(-lp.col_lower_[iCol])) {
        sumInf += -value;
        if (sumInf > options_->small_matrix_value) break;
        continue;
      }
      implied_upper += value * lp.col_lower_[iCol];
    }
  }
  bool infinite_implied_upper = sumInf > options_->small_matrix_value;
  const double gap = double(proof_lower - implied_upper);
  const bool gap_ok = gap > options_->primal_feasibility_tolerance;
  const bool proof_of_primal_infeasibility = !infinite_implied_upper && gap_ok;

  const double local_report = false;
  if (!proof_of_primal_infeasibility && local_report) {
    printf(
        "HEkk::proofOfPrimalInfeasibility: row %6d; gap = %11.4g (%s); "
        "sumInf = %11.4g (%s) so proof is %s\n",
        (int)row_out, gap, highsBoolToString(gap_ok).c_str(), (double)sumInf,
        highsBoolToString(infinite_implied_upper).c_str(),
        highsBoolToString(proof_of_primal_infeasibility).c_str());
  }
  if (debug_proof_report) {
    printf("HEkk::proofOfPrimalInfeasibility has %sfinite implied upper bound",
           infinite_implied_upper ? "in" : "");
    if (!infinite_implied_upper) printf(" and gap = %g", gap);
    printf(" so proof is %s\n",
           proof_of_primal_infeasibility ? "true" : "false");
  }
  return proof_of_primal_infeasibility;
}